

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O3

csp_conn_t * csp_connect(uint8_t prio,uint16_t dest,uint8_t dport,uint32_t timeout,uint32_t opts)

{
  uint8_t uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  csp_conn_t *conn;
  ulong uVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  byte bVar7;
  undefined6 in_register_00000032;
  undefined7 in_register_00000039;
  ulong uVar8;
  uint uVar9;
  
  uVar9 = opts | csp_conf.conn_dfl_so;
  uVar2 = uVar9 & 0xffffffbf;
  if (-1 < (char)uVar9) {
    uVar2 = uVar9;
  }
  bVar3 = (char)uVar2 * '\x02';
  bVar7 = bVar3 & 2;
  uVar6 = CONCAT71(in_register_00000011,dport) & 0xffffffff;
  uVar5 = (ulong)(((byte)(uVar2 >> 6) & 3 | bVar3) & 9 | bVar7) << 8;
  uVar8 = CONCAT71(in_register_00000039,prio) & 0xffffffff;
  conn = csp_conn_new((csp_id_t_conflict)
                      (uVar6 << 0x38 |
                       (ulong)(uint)((int)CONCAT62(in_register_00000032,dest) << 0x10) | uVar5 |
                      uVar8),(csp_id_t_conflict)
                             (CONCAT62(in_register_00000032,dest) << 0x20 | uVar6 << 0x30 | uVar5 |
                             uVar8),CONN_CLIENT);
  if (conn != (csp_conn_t *)0x0) {
    uVar1 = conn->sport_outgoing;
    (conn->idout).sport = uVar1;
    (conn->idin).dport = uVar1;
    conn->dest_socket = (csp_socket_t *)0x0;
    conn->opts = uVar2;
    if (bVar7 == 0) {
      return conn;
    }
    iVar4 = csp_rdp_connect(conn);
    if (iVar4 == 0) {
      return conn;
    }
    csp_conn_close(conn,'\x01');
  }
  return (csp_conn_t *)0x0;
}

Assistant:

csp_conn_t * csp_connect(uint8_t prio, uint16_t dest, uint8_t dport, uint32_t timeout, uint32_t opts) {

	/* Force options on all connections */
	opts |= csp_conf.conn_dfl_so;

	/* Generate identifier */
	csp_id_t incoming_id = {0}, outgoing_id = {0};

	/* Use 0 as incoming id (this disables the input filter on destination node)
	 * This means that for this outgoing connection, we accept the answer coming to whatever address
	 * the outgoing interface has. CSP does not support "source address" on outgoing connections
	 * so the outgoing source address will be automatically applied after outgoing routing
	 * selects which interface the packet will leave from */
	incoming_id.dst = 0;
	outgoing_id.src = 0;

	incoming_id.pri = prio;
	outgoing_id.pri = prio;
	incoming_id.src = dest;
	outgoing_id.dst = dest;
	incoming_id.sport = dport;
	outgoing_id.dport = dport;
	incoming_id.flags = 0;
	outgoing_id.flags = 0;

	/* Set connection options */
	if (opts & CSP_O_NOCRC32) {
		opts &= ~CSP_O_CRC32;
	}

	if (opts & CSP_O_RDP) {
#if (CSP_USE_RDP)
		incoming_id.flags |= CSP_FRDP;
		outgoing_id.flags |= CSP_FRDP;
#else
		csp_dbg_errno = CSP_DBG_ERR_UNSUPPORTED;
		return NULL;
#endif
	}

	if (opts & CSP_O_HMAC) {
#if (CSP_USE_HMAC)
		outgoing_id.flags |= CSP_FHMAC;
		incoming_id.flags |= CSP_FHMAC;
#else
		csp_dbg_errno = CSP_DBG_ERR_UNSUPPORTED;
		return NULL;
#endif
	}

	if (opts & CSP_O_CRC32) {
		outgoing_id.flags |= CSP_FCRC32;
		incoming_id.flags |= CSP_FCRC32;
	}

	/* Find a new connection */
	csp_conn_t * conn = csp_conn_new(incoming_id, outgoing_id, CONN_CLIENT);
	if (conn == NULL) {
		return NULL;
	}

	/* Outgoing connections always use pre-defined source port */
	conn->idout.sport = conn->sport_outgoing;
	conn->idin.dport = conn->sport_outgoing;
	conn->dest_socket = NULL;

	/* Set connection options */
	conn->opts = opts;

#if (CSP_USE_RDP)
	/* Call Transport Layer connect */
	if (outgoing_id.flags & CSP_FRDP) {
		/* If the transport layer has failed to connect
		 * deallocate connection structure again and return NULL */
		if (csp_rdp_connect(conn) != CSP_ERR_NONE) {
			csp_close(conn);
			return NULL;
		}
	}
#endif

	/* We have a successful connection */
	return conn;
}